

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeDamped.cpp
# Opt level: O1

void __thiscall OpenMD::FluctuatingChargeDamped::applyConstraints(FluctuatingChargeDamped *this)

{
  double dVar1;
  int iVar2;
  pointer ppAVar3;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  long lVar6;
  Molecule *pMVar7;
  pointer ppAVar8;
  long lVar9;
  int iVar10;
  Atom *pAVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  MoleculeIterator i;
  MoleculeIterator local_18;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_18._M_node = (_Base_ptr)0x0;
    pMVar7 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    while (pMVar7 != (Molecule *)0x0) {
      ppAVar8 = (pMVar7->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar3 = (pMVar7->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar8 == ppAVar3) {
        pAVar11 = (Atom *)0x0;
      }
      else {
        pAVar11 = *ppAVar8;
      }
      if (pAVar11 != (Atom *)0x0) {
        iVar2 = *(int *)&(this->super_FluctuatingChargePropagator).field_0x2c;
        do {
          DVar4 = (pAVar11->super_StuntDouble).storage_;
          pSVar5 = ((pAVar11->super_StuntDouble).snapshotMan_)->currentSnapshot_;
          lVar9 = (long)(pAVar11->super_StuntDouble).localIndex_;
          lVar6 = *(long *)((long)&(pSVar5->atomData).flucQFrc.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + DVar4);
          dVar1 = *(double *)(lVar6 + lVar9 * 8);
          if (iVar2 < 1) {
            dVar13 = 0.0;
          }
          else {
            dVar12 = 0.0;
            dVar14 = dVar1;
            iVar10 = iVar2;
            do {
              dVar13 = ((dVar14 * this->dt2_) / pAVar11->chargeMass_ +
                       *(double *)
                        (*(long *)((long)&(pSVar5->atomData).flucQVel.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar4) +
                        lVar9 * 8)) * -this->drag_;
              if (ABS(dVar13 - dVar12) <= this->forceTolerance_) break;
              dVar14 = dVar1 + dVar13;
              iVar10 = iVar10 + -1;
              dVar12 = dVar13;
            } while (iVar10 != 0);
          }
          *(double *)(lVar6 + lVar9 * 8) = dVar1 + dVar13;
          ppAVar8 = ppAVar8 + 1;
          if (ppAVar8 == ppAVar3) {
            pAVar11 = (Atom *)0x0;
          }
          else {
            pAVar11 = *ppAVar8;
          }
        } while (pAVar11 != (Atom *)0x0);
      }
      pMVar7 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    }
    FluctuatingChargeConstraints::applyConstraints
              ((this->super_FluctuatingChargePropagator).fqConstraints_);
  }
  return;
}

Assistant:

void FluctuatingChargeDamped::applyConstraints() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cfrc, cmass, frictionForce;
    RealType velStep, oldFF;  // used to test for convergence

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        // What remains contains velocity explicitly, but the velocity
        // required is at the full step: v(t + h), while we have
        // initially the velocity at the half step: v(t + h/2).  We
        // need to iterate to converge the friction force vector.

        // this is the velocity at the half-step:

        cvel = atom->getFlucQVel();

        // estimate velocity at full-step using everything but
        // friction forces:

        cfrc    = atom->getFlucQFrc();
        cmass   = atom->getChargeMass();
        velStep = cvel + dt2_ * cfrc / cmass;

        frictionForce = 0.0;

        // iteration starts here:

        for (int k = 0; k < maxIterNum_; k++) {
          oldFF         = frictionForce;
          frictionForce = -drag_ * velStep;
          // re-estimate velocities at full-step using friction forces:

          velStep = cvel + dt2_ * (cfrc + frictionForce) / cmass;

          // check for convergence

          if (fabs(frictionForce - oldFF) <= forceTolerance_)
            break;  // iteration ends here
        }
        atom->addFlucQFrc(frictionForce);
      }
    }
    fqConstraints_->applyConstraints();
  }